

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

optional<tinyusdz::ascii::AsciiParser::VariableDef> * __thiscall
tinyusdz::ascii::AsciiParser::GetPropMetaDefinition
          (optional<tinyusdz::ascii::AsciiParser::VariableDef> *__return_storage_ptr__,
          AsciiParser *this,string *name)

{
  size_type sVar1;
  mapped_type *value;
  string *name_local;
  AsciiParser *this_local;
  
  sVar1 = ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
          ::count(&this->_supported_prop_metas,name);
  if (sVar1 == 0) {
    nonstd::optional_lite::optional<tinyusdz::ascii::AsciiParser::VariableDef>::optional
              (__return_storage_ptr__);
  }
  else {
    value = ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
            ::at(&this->_supported_prop_metas,name);
    nonstd::optional_lite::optional<tinyusdz::ascii::AsciiParser::VariableDef>::
    optional<tinyusdz::ascii::AsciiParser::VariableDef_&,_0>(__return_storage_ptr__,value);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<AsciiParser::VariableDef> AsciiParser::GetPropMetaDefinition(
    const std::string &name) {
  if (_supported_prop_metas.count(name)) {
    return _supported_prop_metas.at(name);
  }

  return nonstd::nullopt;
}